

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::CheckpointReader::ReadIndex
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  Catalog *this_00;
  pointer pIVar1;
  __type _Var2;
  int iVar3;
  pointer pCVar4;
  pointer pCVar5;
  SchemaCatalogEntry *this_01;
  CatalogEntry *pCVar6;
  undefined4 extraout_var;
  CatalogEntry *pCVar7;
  DataTable *this_02;
  TableIOManager *args_2;
  DataTableInfo *pDVar8;
  IOException *this_03;
  pointer __lhs;
  BlockPointer BVar9;
  templated_unique_single_t unbound_index;
  _Head_base<0UL,_duckdb::UnboundIndex_*,_false> local_110;
  undefined1 local_108 [8];
  optional_ptr<duckdb::CatalogEntry,_true> catalog_table;
  undefined1 local_d0 [40];
  atomic<unsigned_long> *local_a8;
  size_t local_a0;
  __node_base local_98;
  _Elt_pointer prStack_90;
  float local_88;
  _Map_pointer local_80;
  atomic<unsigned_long> aStack_78;
  pointer local_70;
  pointer pFStack_68;
  pointer local_60;
  pointer pvStack_58;
  pointer local_50;
  pointer pvStack_48;
  BlockPointer local_40;
  undefined4 extraout_var_00;
  
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)local_108,(field_id_t)deserializer,(char *)0x64);
  pCVar4 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)local_108);
  BVar9 = Deserializer::ReadPropertyWithExplicitDefault<duckdb::BlockPointer>
                    (deserializer,0x65,"root_block_pointer",
                     (BlockPointer)ZEXT816(0xffffffffffffffff));
  this_00 = this->catalog;
  pCVar5 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)local_108);
  this_01 = Catalog::GetSchema(this_00,transaction,&pCVar5->schema);
  catalog_table =
       SchemaCatalogEntry::GetEntry(this_01,transaction,TABLE_ENTRY,(string *)(pCVar4 + 1));
  if (catalog_table.ptr == (CatalogEntry *)0x0) {
    this_03 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_d0,"corrupt database file - index entry without table entry",
               (allocator *)&unbound_index);
    IOException::IOException(this_03,(string *)local_d0);
    __cxa_throw(this_03,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar6 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&catalog_table);
  if (pCVar4[1].dependencies.set._M_h._M_bucket_count == 0) {
    ::std::__cxx11::string::assign((char *)&pCVar4[1].dependencies);
  }
  iVar3 = (*(this_01->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x12])
                    (this_01,pCVar4,pCVar6);
  local_d0._0_8_ = CONCAT44(extraout_var,iVar3);
  pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                     ((optional_ptr<duckdb::CatalogEntry,_true> *)local_d0);
  iVar3 = (*pCVar6->_vptr_CatalogEntry[0x10])(pCVar6);
  this_02 = (DataTable *)CONCAT44(extraout_var_00,iVar3);
  local_d0._0_8_ = local_d0 + 0x10;
  local_d0._8_8_ = (_Elt_pointer)0x0;
  local_d0[0x10] = '\0';
  local_a8 = &aStack_78;
  local_a0 = 1;
  local_98._M_nxt = (_Hash_node_base *)0x0;
  prStack_90 = (_Elt_pointer)0x0;
  local_88 = 1.0;
  local_80 = (_Map_pointer)0x0;
  aStack_78.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_70 = (pointer)0x0;
  pFStack_68 = (pointer)0x0;
  local_60 = (pointer)0x0;
  pvStack_58 = (pointer)0x0;
  local_50 = (pointer)0x0;
  pvStack_48 = (pointer)0x0;
  local_40 = (BlockPointer)ZEXT816(0xffffffffffffffff);
  if (BVar9.block_id == -1) {
    pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this_02->info);
    pIVar1 = (pDVar8->index_storage_infos).
             super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
             super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (pDVar8->index_storage_infos).
                 super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
                 super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pIVar1; __lhs = __lhs + 1) {
      _Var2 = ::std::operator==(&__lhs->name,&pCVar7->name);
      if (_Var2) {
        IndexStorageInfo::operator=((IndexStorageInfo *)local_d0,__lhs);
        break;
      }
    }
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)local_d0);
    local_40 = BVar9;
  }
  args_2 = DataTable::GetTableIOManager(this_02);
  make_uniq<duckdb::UnboundIndex,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::IndexStorageInfo&,duckdb::TableIOManager&,duckdb::AttachedDatabase&>
            ((duckdb *)&unbound_index,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             local_108,(IndexStorageInfo *)local_d0,args_2,this_02->db);
  pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this_02->info);
  local_110._M_head_impl = (UnboundIndex *)unbound_index;
  unbound_index.super_unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>.
  _M_t.super___uniq_ptr_impl<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::UnboundIndex_*,_std::default_delete<duckdb::UnboundIndex>_>.
  super__Head_base<0UL,_duckdb::UnboundIndex_*,_false>._M_head_impl =
       (unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>)
       (__uniq_ptr_data<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>,_true,_true>
       )0x0;
  TableIndexList::AddIndex
            (&pDVar8->indexes,
             (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)&local_110);
  if ((_Head_base<0UL,_duckdb::UnboundIndex_*,_false>)local_110._M_head_impl !=
      (_Head_base<0UL,_duckdb::UnboundIndex_*,_false>)0x0) {
    (*((local_110._M_head_impl)->super_Index)._vptr_Index[1])();
  }
  local_110._M_head_impl = (UnboundIndex *)0x0;
  ::std::unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>::~unique_ptr
            (&unbound_index.
              super_unique_ptr<duckdb::UnboundIndex,_std::default_delete<duckdb::UnboundIndex>_>);
  IndexStorageInfo::~IndexStorageInfo((IndexStorageInfo *)local_d0);
  if ((__uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)local_108 !=
      (__uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)0x0) {
    (**(code **)(*(_func_int **)local_108 + 8))();
  }
  return;
}

Assistant:

void CheckpointReader::ReadIndex(CatalogTransaction transaction, Deserializer &deserializer) {
	// we need to keep the tag "index", even though it is slightly misleading.
	auto create_info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "index");
	auto &info = create_info->Cast<CreateIndexInfo>();

	// also, we have to read the root_block_pointer, which will not be valid for newer storage versions.
	// This leads to different code paths in this function.
	auto root_block_pointer =
	    deserializer.ReadPropertyWithExplicitDefault<BlockPointer>(101, "root_block_pointer", BlockPointer());

	// create the index in the catalog

	// look for the table in the catalog
	auto &schema = catalog.GetSchema(transaction, create_info->schema);
	auto catalog_table = schema.GetEntry(transaction, CatalogType::TABLE_ENTRY, info.table);
	if (!catalog_table) {
		// See internal issue 3663.
		throw IOException("corrupt database file - index entry without table entry");
	}
	auto &table = catalog_table->Cast<DuckTableEntry>();

	// we also need to make sure the index type is loaded
	// backwards compatibility:
	// if the index type is not specified, we default to ART
	if (info.index_type.empty()) {
		info.index_type = ART::TYPE_NAME;
	}

	// now we can look for the index in the catalog and assign the table info
	auto &index = schema.CreateIndex(transaction, info, table)->Cast<DuckIndexEntry>();
	auto &data_table = table.GetStorage();
	auto &table_info = data_table.GetDataTableInfo();

	IndexStorageInfo index_storage_info;
	if (root_block_pointer.IsValid()) {
		// Read older duckdb files.
		index_storage_info.name = index.name;
		index_storage_info.root_block_ptr = root_block_pointer;

	} else {
		// Read the matching index storage info.
		for (auto const &elem : table_info->GetIndexStorageInfo()) {
			if (elem.name == index.name) {
				index_storage_info = elem;
				break;
			}
		}
	}

	D_ASSERT(index_storage_info.IsValid());
	D_ASSERT(!index_storage_info.name.empty());

	// Create an unbound index and add it to the table.
	auto unbound_index = make_uniq<UnboundIndex>(std::move(create_info), index_storage_info,
	                                             TableIOManager::Get(data_table), data_table.db);
	table_info->GetIndexes().AddIndex(std::move(unbound_index));
}